

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::java::JavaGenerator::Generate
          (JavaGenerator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  pointer puVar1;
  pointer puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  pointer ppVar5;
  bool bVar6;
  int iVar7;
  FileGenerator *pFVar8;
  ZeroCopyOutputStream *pZVar9;
  ZeroCopyOutputStream *output;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  AnnotationCollector *annotation_collector_00;
  unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
  *file_generator;
  FileDescriptor *pFVar10;
  long lVar11;
  ulong uVar12;
  string *psVar13;
  AlphaNum *c;
  pointer ppVar14;
  string_view text;
  string_view text_00;
  string_view text_01;
  vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
  file_generators;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_annotations;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_files;
  string java_filename;
  string package_dir;
  string info_full_path;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  Printer printer;
  GeneratedCodeInfo annotations;
  vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
  local_308;
  undefined1 local_2e8 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  FileDescriptor *local_2b0;
  undefined1 local_2a8 [8];
  _Alloc_hider local_2a0;
  size_type local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  _Alloc_hider local_280;
  size_type local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  undefined2 local_260;
  string local_258;
  string local_238;
  string local_218;
  undefined1 local_1f8 [48];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c8;
  AnnotationCollector local_1a8;
  AlphaNum *local_1a0;
  Printer local_198;
  AlphaNum local_60;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  local_1c8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  text._M_str = (char *)&local_1c8;
  text._M_len = (size_t)(parameter->_M_dataplus)._M_p;
  c = (AlphaNum *)error;
  ParseGeneratorParameter
            ((compiler *)parameter->_M_string_length,text,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)context);
  ppVar5 = local_1c8.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_2a8._0_4_ = 0;
  local_2a8[5] = false;
  local_2a0._M_p = (pointer)&local_290;
  local_298 = 0;
  local_290._M_local_buf[0] = '\0';
  local_280._M_p = (pointer)&local_270;
  local_278 = 0;
  local_270._M_local_buf[0] = '\0';
  local_260._0_1_ = false;
  local_260._1_1_ = true;
  local_2a8[4] = this->opensource_runtime_;
  ppVar14 = local_1c8.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pFVar10 = file;
  if (local_1c8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1c8.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_2b0 = pFVar10;
      iVar7 = std::__cxx11::string::compare((char *)ppVar14);
      psVar13 = (string *)&local_280;
      if (iVar7 == 0) {
LAB_00df43d4:
        std::__cxx11::string::_M_assign(psVar13);
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)ppVar14);
        if (iVar7 == 0) {
          local_2a8[0] = 1;
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)ppVar14);
          if (iVar7 == 0) {
            local_2a8[1] = true;
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)ppVar14);
            if (iVar7 == 0) {
              local_2a8[2] = true;
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)ppVar14);
              if (iVar7 == 0) {
                local_2a8[3] = 1;
              }
              else {
                iVar7 = std::__cxx11::string::compare((char *)ppVar14);
                if (iVar7 == 0) {
                  local_2a8[5] = true;
                }
                else {
                  iVar7 = std::__cxx11::string::compare((char *)ppVar14);
                  psVar13 = (string *)&local_2a0;
                  if (iVar7 == 0) goto LAB_00df43d4;
                  iVar7 = std::__cxx11::string::compare((char *)ppVar14);
                  if (iVar7 != 0) {
                    local_198.sink_.stream_ = (ZeroCopyOutputStream *)0x1a;
                    local_198.sink_.buffer_ = "Unknown generator option: ";
                    local_60.piece_._M_str = (ppVar14->first)._M_dataplus._M_p;
                    local_60.piece_._M_len = (ppVar14->first)._M_string_length;
                    absl::lts_20250127::StrCat_abi_cxx11_
                              ((string *)local_1f8,(lts_20250127 *)&local_198,&local_60,
                               (AlphaNum *)local_60.piece_._M_len);
                    std::__cxx11::string::operator=((string *)error,(string *)local_1f8);
                    if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
                      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
                    }
                    bVar6 = false;
                    goto LAB_00df4b56;
                  }
                  local_260._0_1_ = true;
                }
              }
            }
          }
        }
      }
      ppVar14 = ppVar14 + 1;
      pFVar10 = local_2b0;
    } while (ppVar14 != ppVar5);
    file = local_2b0;
    if (((local_2a8._0_4_ & 0x1000000) != 0) && ((bool)local_2a8[1] == true)) {
      bVar6 = false;
      std::__cxx11::string::_M_replace((ulong)error,0,(char *)error->_M_string_length,0x12f1414);
      goto LAB_00df4b56;
    }
  }
  uVar3 = local_2a8._0_4_;
  if ((((bool)local_2a8[0] == false) && ((bool)local_2a8[1] == false)) &&
     ((bool)local_2a8[2] == false)) {
    local_2a8[0] = true;
    uVar4 = local_2a8._0_4_;
    local_2a8[3] = SUB41(uVar3,3);
    local_2a8._0_2_ = (undefined2)uVar4;
    local_2a8[2] = true;
LAB_00df44af:
    local_2c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2e8._16_8_ = (pointer)0x0;
    local_2e8._8_8_ = (pointer)0x0;
    local_2e8._0_8_ = (pointer)0x0;
    local_308.
    super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_308.
    super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_308.
    super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pFVar8 = (FileGenerator *)operator_new(0xe8);
    FileGenerator::FileGenerator(pFVar8,file,(Options *)local_2a8,true);
    local_198.sink_.stream_ = (ZeroCopyOutputStream *)pFVar8;
    std::
    vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>>>
    ::
    emplace_back<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>>
              ((vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>>>
                *)&local_308,
               (unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                *)&local_198);
    std::
    unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
    ::~unique_ptr((unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                   *)&local_198);
  }
  else {
    local_2c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2e8._16_8_ = (pointer)0x0;
    local_2e8._0_8_ = (pointer)0x0;
    local_2e8._8_8_ = (pointer)0x0;
    local_308.
    super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_308.
    super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_308.
    super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((bool)local_2a8[0] != false) goto LAB_00df44af;
  }
  if ((bool)local_2a8[1] == true) {
    pFVar8 = (FileGenerator *)operator_new(0xe8);
    FileGenerator::FileGenerator(pFVar8,file,(Options *)local_2a8,false);
    local_198.sink_.stream_ = (ZeroCopyOutputStream *)pFVar8;
    std::
    vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>>>
    ::
    emplace_back<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>>
              ((vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>>>
                *)&local_308,
               (unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                *)&local_198);
    std::
    unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
    ::~unique_ptr((unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                   *)&local_198);
  }
  puVar1 = local_308.
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pFVar10 = (FileDescriptor *)
            local_308.
            super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_308.
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_308.
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      bVar6 = FileGenerator::Validate(*(FileGenerator **)pFVar10,error);
      puVar2 = local_308.
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (!bVar6) {
        bVar6 = false;
        goto LAB_00df4b38;
      }
      pFVar10 = (FileDescriptor *)&pFVar10->name_;
    } while (pFVar10 != (FileDescriptor *)puVar1);
    if (local_308.
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_308.
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_2b0 = (FileDescriptor *)
                  local_308.
                  super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      pFVar10 = (FileDescriptor *)
                local_308.
                super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        lVar11 = *(long *)(*(long *)pFVar10 + 8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_238,lVar11,*(long *)(*(long *)pFVar10 + 0x10) + lVar11);
        JavaPackageToDir(&local_218,&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        local_198.sink_.stream_ = (ZeroCopyOutputStream *)local_218._M_string_length;
        local_198.sink_.buffer_ = local_218._M_dataplus._M_p;
        local_60.piece_._M_str = *(char **)(*(long *)pFVar10 + 0x28);
        local_60.piece_._M_len = *(size_t *)(*(long *)pFVar10 + 0x30);
        local_1f8._0_8_ = &DAT_00000005;
        local_1f8._8_8_ = ".java";
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&local_258,(lts_20250127 *)&local_198,&local_60,(AlphaNum *)local_1f8,c);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_2c8,&local_258);
        local_198.sink_.stream_ = (ZeroCopyOutputStream *)local_258._M_string_length;
        local_198.sink_.buffer_ = local_258._M_dataplus._M_p;
        local_60.piece_._M_len = (size_t)&DAT_00000008;
        local_60.piece_._M_str = ".pb.meta";
        absl::lts_20250127::StrCat_abi_cxx11_
                  ((string *)local_1f8,(lts_20250127 *)&local_198,&local_60,
                   (AlphaNum *)local_258._M_string_length);
        if (local_2a8[5] == true) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_2e8,(value_type *)local_1f8);
        }
        iVar7 = (*context->_vptr_GeneratorContext[2])();
        pZVar9 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar7);
        GeneratedCodeInfo::GeneratedCodeInfo((GeneratedCodeInfo *)&local_60,(Arena *)0x0);
        local_1a8._vptr_AnnotationCollector = (_func_int **)&PTR__AnnotationCollector_018f7f90;
        annotation_collector_00 = (AnnotationCollector *)0x0;
        if (local_2a8[5] != false) {
          annotation_collector_00 = &local_1a8;
        }
        local_1a0 = &local_60;
        io::Printer::Printer(&local_198,pZVar9,'$',annotation_collector_00);
        FileGenerator::Generate(*(FileGenerator **)pFVar10,&local_198);
        c = (AlphaNum *)local_2e8;
        FileGenerator::GenerateSiblings
                  (*(FileGenerator **)pFVar10,&local_218,context,&local_2c8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)c);
        if (local_2a8[5] == true) {
          iVar7 = (*context->_vptr_GeneratorContext[2])(context,(AlphaNum *)local_1f8);
          output = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar7);
          MessageLite::SerializeToZeroCopyStream((MessageLite *)&local_60,output);
          if (output != (ZeroCopyOutputStream *)0x0) {
            (*output->_vptr_ZeroCopyOutputStream[1])(output);
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_198.line_start_variables_);
        absl::lts_20250127::container_internal::
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
        ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                         *)&local_198.substitutions_);
        (*local_198.substitution_listener_.
          super_Impl<void_(std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation)>
          .
          super_CoreImpl<false,_void,_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation>
          .manager_)(dispose,(TypeErasedState *)&local_198.substitution_listener_,
                     (TypeErasedState *)&local_198.substitution_listener_);
        std::
        vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
        ::~vector(&local_198.annotation_lookups_);
        std::
        vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
        ::~vector(&local_198.var_lookups_);
        if (local_198.paren_depth_to_omit_.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_198.paren_depth_to_omit_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_198.paren_depth_to_omit_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_198.paren_depth_to_omit_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_198.sink_.buffer_size_ != 0) {
          (*(code *)((FileDescriptor *)(local_198.sink_.stream_)->_vptr_ZeroCopyOutputStream)->pool_
          )();
        }
        GeneratedCodeInfo::~GeneratedCodeInfo((GeneratedCodeInfo *)&local_60);
        if (pZVar9 != (ZeroCopyOutputStream *)0x0) {
          (*pZVar9->_vptr_ZeroCopyOutputStream[1])(pZVar9);
        }
        if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        pFVar10 = (FileDescriptor *)&pFVar10->name_;
      } while (pFVar10 != (FileDescriptor *)puVar2);
    }
    puVar2 = local_308.
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar1 = local_308.
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pFVar10 = (FileDescriptor *)
              local_308.
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_308.
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_308.
        super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      do {
        std::
        unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
        ::~unique_ptr((unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                       *)pFVar10);
        pFVar10 = (FileDescriptor *)&pFVar10->name_;
      } while (pFVar10 != (FileDescriptor *)puVar2);
      local_308.
      super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = puVar1;
    }
  }
  if (local_278 != 0) {
    iVar7 = (*context->_vptr_GeneratorContext[2])(context,&local_280);
    pZVar9 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_01,iVar7);
    io::Printer::Printer(&local_198,pZVar9,'$',(AnnotationCollector *)0x0);
    if (local_2c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_2c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar11 = 0;
      uVar12 = 0;
      do {
        text_00._M_str = "$filename$\n";
        text_00._M_len = 0xb;
        io::Printer::Print<char[9],std::__cxx11::string>
                  (&local_198,text_00,(char (*) [9])"filename",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&((local_2c8.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar11)
                  );
        uVar12 = uVar12 + 1;
        lVar11 = lVar11 + 0x20;
      } while (uVar12 < (ulong)((long)local_2c8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_2c8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_198.line_start_variables_);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                     *)&local_198.substitutions_);
    (*local_198.substitution_listener_.
      super_Impl<void_(std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation)>
      .
      super_CoreImpl<false,_void,_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation>
      .manager_)(dispose,(TypeErasedState *)&local_198.substitution_listener_,
                 (TypeErasedState *)&local_198.substitution_listener_);
    std::
    vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
    ::~vector(&local_198.annotation_lookups_);
    std::
    vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
    ::~vector(&local_198.var_lookups_);
    if (local_198.paren_depth_to_omit_.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_198.paren_depth_to_omit_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_198.paren_depth_to_omit_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_198.paren_depth_to_omit_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_198.sink_.buffer_size_ != 0) {
      (*(code *)((FileDescriptor *)(local_198.sink_.stream_)->_vptr_ZeroCopyOutputStream)->pool_)();
    }
    if (pZVar9 != (ZeroCopyOutputStream *)0x0) {
      (*pZVar9->_vptr_ZeroCopyOutputStream[1])(pZVar9);
    }
  }
  bVar6 = true;
  if (local_298 != 0) {
    iVar7 = (*context->_vptr_GeneratorContext[2])(context,&local_2a0);
    pZVar9 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_02,iVar7);
    io::Printer::Printer(&local_198,pZVar9,'$',(AnnotationCollector *)0x0);
    if (local_2e8._8_8_ != local_2e8._0_8_) {
      lVar11 = 0;
      uVar12 = 0;
      do {
        text_01._M_str = "$filename$\n";
        text_01._M_len = 0xb;
        io::Printer::Print<char[9],std::__cxx11::string>
                  (&local_198,text_01,(char (*) [9])"filename",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&((_Alloc_hider *)local_2e8._0_8_)->_M_p + lVar11));
        uVar12 = uVar12 + 1;
        lVar11 = lVar11 + 0x20;
      } while (uVar12 < (ulong)((long)(local_2e8._8_8_ - local_2e8._0_8_) >> 5));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_198.line_start_variables_);
    absl::lts_20250127::container_internal::
    raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
    ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
                     *)&local_198.substitutions_);
    (*local_198.substitution_listener_.
      super_Impl<void_(std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation)>
      .
      super_CoreImpl<false,_void,_std::basic_string_view<char,_std::char_traits<char>_>,_google::protobuf::io::Printer::SourceLocation>
      .manager_)(dispose,(TypeErasedState *)&local_198.substitution_listener_,
                 (TypeErasedState *)&local_198.substitution_listener_);
    std::
    vector<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::AnnotationRecord>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
    ::~vector(&local_198.annotation_lookups_);
    std::
    vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
    ::~vector(&local_198.var_lookups_);
    if (local_198.paren_depth_to_omit_.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_198.paren_depth_to_omit_.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_198.paren_depth_to_omit_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_198.paren_depth_to_omit_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    bVar6 = true;
    if (local_198.sink_.buffer_size_ != 0) {
      (*(code *)((FileDescriptor *)(local_198.sink_.stream_)->_vptr_ZeroCopyOutputStream)->pool_)();
    }
    if (pZVar9 != (ZeroCopyOutputStream *)0x0) {
      (*pZVar9->_vptr_ZeroCopyOutputStream[1])(pZVar9);
    }
  }
LAB_00df4b38:
  std::
  vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
  ::~vector(&local_308);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_2e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2c8);
LAB_00df4b56:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_p != &local_270) {
    operator_delete(local_280._M_p,
                    CONCAT71(local_270._M_allocated_capacity._1_7_,local_270._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_p != &local_290) {
    operator_delete(local_2a0._M_p,
                    CONCAT71(local_290._M_allocated_capacity._1_7_,local_290._M_local_buf[0]) + 1);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_1c8);
  return bVar6;
}

Assistant:

bool JavaGenerator::Generate(const FileDescriptor* file,
                             const std::string& parameter,
                             GeneratorContext* context,
                             std::string* error) const {
  // -----------------------------------------------------------------
  // parse generator options

  std::vector<std::pair<std::string, std::string> > options;
  ParseGeneratorParameter(parameter, &options);
  Options file_options;

  file_options.opensource_runtime = opensource_runtime_;

  for (auto& option : options) {
    if (option.first == "output_list_file") {
      file_options.output_list_file = option.second;
    } else if (option.first == "immutable") {
      file_options.generate_immutable_code = true;
    } else if (option.first == "mutable") {
      file_options.generate_mutable_code = true;
    } else if (option.first == "shared") {
      file_options.generate_shared_code = true;
    } else if (option.first == "lite") {
      // Note: Java Lite does not guarantee API/ABI stability. We may choose to
      // break existing API in order to boost performance / reduce code size.
      file_options.enforce_lite = true;
    } else if (option.first == "annotate_code") {
      file_options.annotate_code = true;
    } else if (option.first == "annotation_list_file") {
      file_options.annotation_list_file = option.second;
    } else if (option.first == "experimental_strip_nonfunctional_codegen") {
      file_options.strip_nonfunctional_codegen = true;
    } else {
      *error = absl::StrCat("Unknown generator option: ", option.first);
      return false;
    }
  }

  if (file_options.enforce_lite && file_options.generate_mutable_code) {
    *error = "lite runtime generator option cannot be used with mutable API.";
    return false;
  }

  // By default we generate immutable code and shared code for immutable API.
  if (!file_options.generate_immutable_code &&
      !file_options.generate_mutable_code &&
      !file_options.generate_shared_code) {
    file_options.generate_immutable_code = true;
    file_options.generate_shared_code = true;
  }

  // -----------------------------------------------------------------


  std::vector<std::string> all_files;
  std::vector<std::string> all_annotations;


  std::vector<std::unique_ptr<FileGenerator>> file_generators;
  if (file_options.generate_immutable_code) {
    file_generators.emplace_back(
        std::make_unique<FileGenerator>(file, file_options,
                                        /* immutable = */ true));
  }
  if (file_options.generate_mutable_code) {
    file_generators.emplace_back(
        std::make_unique<FileGenerator>(file, file_options,
                                        /* mutable = */ false));
  }

  for (auto& file_generator : file_generators) {
    if (!file_generator->Validate(error)) {
      return false;
    }
  }

  for (auto& file_generator : file_generators) {
    std::string package_dir = JavaPackageToDir(file_generator->java_package());

    std::string java_filename =
        absl::StrCat(package_dir, file_generator->classname(), ".java");
    all_files.push_back(java_filename);
    std::string info_full_path = absl::StrCat(java_filename, ".pb.meta");
    if (file_options.annotate_code) {
      all_annotations.push_back(info_full_path);
    }

    // Generate main java file.
    std::unique_ptr<io::ZeroCopyOutputStream> output(
        context->Open(java_filename));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    io::Printer printer(
        output.get(), '$',
        file_options.annotate_code ? &annotation_collector : nullptr);

    file_generator->Generate(&printer);

    // Generate sibling files.
    file_generator->GenerateSiblings(package_dir, context, &all_files,
                                     &all_annotations);

    if (file_options.annotate_code) {
      std::unique_ptr<io::ZeroCopyOutputStream> info_output(
          context->Open(info_full_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
    }
  }


  file_generators.clear();

  // Generate output list if requested.
  if (!file_options.output_list_file.empty()) {
    // Generate output list.  This is just a simple text file placed in a
    // deterministic location which lists the .java files being generated.
    std::unique_ptr<io::ZeroCopyOutputStream> srclist_raw_output(
        context->Open(file_options.output_list_file));
    io::Printer srclist_printer(srclist_raw_output.get(), '$');
    for (int i = 0; i < all_files.size(); i++) {
      srclist_printer.Print("$filename$\n", "filename", all_files[i]);
    }
  }

  if (!file_options.annotation_list_file.empty()) {
    // Generate output list.  This is just a simple text file placed in a
    // deterministic location which lists the .java files being generated.
    std::unique_ptr<io::ZeroCopyOutputStream> annotation_list_raw_output(
        context->Open(file_options.annotation_list_file));
    io::Printer annotation_list_printer(annotation_list_raw_output.get(), '$');
    for (int i = 0; i < all_annotations.size(); i++) {
      annotation_list_printer.Print("$filename$\n", "filename",
                                    all_annotations[i]);
    }
  }

  return true;
}